

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

SRes SzArEx_Open(CSzArEx *p,ILookInStream *inStream,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  CSzBitUi32s *p_00;
  ulong *puVar1;
  Byte BVar2;
  ulong uVar3;
  ISzAlloc *pIVar4;
  int __result__;
  SRes SVar5;
  UInt32 UVar6;
  int iVar7;
  int iVar8;
  UInt32 UVar9;
  uint uVar10;
  size_t *psVar11;
  Byte *pBVar12;
  UInt32 *pUVar13;
  UInt64 *pUVar14;
  Byte *pBVar15;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  undefined8 uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  UInt64 *pUVar23;
  size_t sVar25;
  CSzBitUi64s *p_01;
  CSzData *sd2;
  byte bVar26;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  uint local_23c;
  ulong local_230;
  CSzData sd;
  byte local_218;
  UInt32 *local_1f8;
  UInt64 type_3;
  ISzAlloc *local_1e8;
  UInt64 type_1;
  Byte *local_1d8;
  ulong local_1d0;
  Byte *local_1c8;
  ulong local_1c0;
  Byte *local_1b8;
  UInt32 numFiles;
  undefined8 local_1a8;
  Byte *local_1a0;
  UInt64 *local_198;
  UInt64 type;
  UInt32 index_1;
  CBuf buf;
  Int64 startArcPos;
  CSubStreamInfo local_168;
  UInt64 size;
  CBuf tempBuf;
  Byte header [32];
  Int64 pos;
  UInt64 *pUStack_b0;
  Byte *local_a8;
  UInt32 *pUStack_a0;
  size_t *local_98;
  UInt32 *pUStack_90;
  UInt32 *local_88;
  Byte *pBStack_80;
  UInt64 *local_78;
  Byte *pBStack_70;
  UInt64 *pUVar24;
  byte bVar27;
  
  startArcPos = 0;
  SVar5 = (*inStream->Seek)(inStream,&startArcPos,SZ_SEEK_CUR);
  if (SVar5 == 0) {
    SVar5 = LookInStream_Read2(inStream,header,0x20,0x11);
    if (SVar5 == 0) {
      lVar28 = 0;
LAB_00599aaa:
      SVar5 = 0x11;
      if (lVar28 != 6) goto code_r0x00599ab0;
      if (header[6] != '\0') {
        SVar5 = 4;
        goto LAB_00599a81;
      }
      p->startPosAfterHeader = startArcPos + 0x20;
      local_1e8 = allocTemp;
      UVar6 = CrcCalc(header + 0xc,0x14);
      if (UVar6 != header._8_4_) {
        SVar5 = 3;
        goto LAB_00599a81;
      }
      if (header._20_8_ == 0) goto LAB_00599e04;
      if (-header._20_8_ - 0x21 < (ulong)header._12_8_ || CARRY8(header._12_8_,header._20_8_))
      goto LAB_00599a81;
      pos = 0;
      SVar5 = (*inStream->Seek)(inStream,&pos,SZ_SEEK_END);
      if (SVar5 != 0) goto LAB_00599a81;
      if ((ulong)pos < (ulong)(startArcPos + header._12_8_)) {
        SVar5 = 6;
        goto LAB_00599a81;
      }
      uVar22 = startArcPos + header._12_8_ + 0x20;
      if ((ulong)pos < startArcPos + header._12_8_ + header._20_8_ + 0x20U || (ulong)pos < uVar22) {
        SVar5 = 6;
        goto LAB_00599a81;
      }
      SVar5 = LookInStream_SeekTo(inStream,uVar22);
      if ((SVar5 != 0) || (iVar7 = Buf_Create(&buf,header._20_8_,local_1e8), SVar5 = 2, iVar7 == 0))
      goto LAB_00599a81;
      SVar5 = LookInStream_Read(inStream,buf.data,header._20_8_);
      if (SVar5 != 0) goto LAB_00599de9;
      UVar6 = CrcCalc(buf.data,header._20_8_);
      if (UVar6 != header._28_4_) {
        SVar5 = 0x10;
        goto LAB_00599de9;
      }
      sd.Data = buf.data;
      sd.Size = buf.size;
      SVar5 = ReadNumber(&sd,&type);
      if ((SVar5 == 0) && (type == 0x17)) {
        Buf_Init(&tempBuf);
        pIVar4 = local_1e8;
        local_78 = (UInt64 *)0x0;
        pBStack_70 = (Byte *)0x0;
        local_88 = (UInt32 *)0x0;
        pBStack_80 = (Byte *)0x0;
        local_98 = (size_t *)0x0;
        pUStack_90 = (UInt32 *)0x0;
        local_a8 = (Byte *)0x0;
        pUStack_a0 = (UInt32 *)0x0;
        pos = 0;
        pUStack_b0 = (UInt64 *)0x0;
        SVar5 = SzReadAndDecodePackedStreams
                          (inStream,&sd,&tempBuf,1,p->startPosAfterHeader,(CSzAr *)&pos,local_1e8);
        SzAr_Free((CSzAr *)&pos,pIVar4);
        if (SVar5 == 0) {
          Buf_Free(&buf,local_1e8);
          buf.data = tempBuf.data;
          buf.size = tempBuf.size;
          sd.Data = tempBuf.data;
          sd.Size = tempBuf.size;
          SVar5 = ReadNumber(&sd,&type);
        }
        else {
          Buf_Free(&tempBuf,local_1e8);
        }
      }
      if (SVar5 != 0) goto LAB_00599de9;
      if (type != 1) {
        SVar5 = 4;
        goto LAB_00599de9;
      }
      for (lVar28 = 0; lVar28 != 0x80; lVar28 = lVar28 + 0x10) {
        Buf_Init((CBuf *)((long)&pos + lVar28));
      }
      numFiles = 0;
      local_168.sdSizes.Size = 0;
      local_168.sdCRCs.Data = (Byte *)0x0;
      local_168.sdNumSubStreams.Size = 0;
      local_168.sdSizes.Data = (Byte *)0x0;
      local_168.NumTotalSubStreams = 0;
      local_168.NumSubDigests = 0;
      local_168.sdNumSubStreams.Data = (Byte *)0x0;
      local_168.sdCRCs.Size = 0;
      iVar7 = ReadNumber(&sd,&type_1);
      if (iVar7 != 0) goto LAB_00599da8;
      if (type_1 == 2) {
        do {
          iVar7 = ReadNumber(&sd,(UInt64 *)&tempBuf);
          if (iVar7 != 0) break;
          if (tempBuf.data == (Byte *)0x0) {
            iVar7 = ReadNumber(&sd,&type_1);
            if (iVar7 == 0) goto LAB_00599e7b;
            break;
          }
          iVar7 = SkipData(&sd);
        } while (iVar7 == 0);
      }
      else {
LAB_00599e7b:
        pIVar4 = local_1e8;
        local_230._0_4_ = 0;
        if (type_1 == 3) {
          tempBuf.data = (Byte *)0x0;
          tempBuf.size = 0;
          iVar7 = SzReadAndDecodePackedStreams
                            (inStream,&sd,(CBuf *)&pos,8,p->startPosAfterHeader,(CSzAr *)&tempBuf,
                             local_1e8);
          local_230._0_4_ = (UInt32)((ulong)tempBuf.data >> 0x20);
          SzAr_Free((CSzAr *)&tempBuf,pIVar4);
          if ((iVar7 != 0) || (iVar7 = ReadNumber(&sd,&type_1), iVar7 != 0)) goto LAB_00599da8;
        }
        if (type_1 == 4) {
          iVar7 = SzReadStreamsInfo(&p->db,&sd,0x40000000,(CBuf *)&pos,(UInt32)local_230,&p->dataPos
                                    ,&local_168,allocMain);
          if (iVar7 == 0) {
            p->dataPos = p->dataPos + p->startPosAfterHeader;
            iVar7 = ReadNumber(&sd,&type_1);
            if (iVar7 == 0) goto LAB_00599f8a;
          }
        }
        else {
LAB_00599f8a:
          if (type_1 == 0) {
            iVar7 = 0;
          }
          else if (type_1 == 5) {
            iVar7 = SzReadNumber32(&sd,&numFiles);
            UVar6 = numFiles;
            if (iVar7 == 0) {
              uVar22 = (ulong)numFiles;
              p->NumFiles = numFiles;
              p_00 = &p->Attribs;
              local_1c0 = (ulong)(numFiles + 7 >> 3);
              local_198 = (UInt64 *)((ulong)(numFiles + 1) << 3);
              local_1b8 = (Byte *)0x0;
              iVar8 = 0x10;
              UVar9 = 0;
LAB_0059a02b:
              local_1d0 = (ulong)(UVar9 + 7 >> 3);
              local_1a0 = (Byte *)0x0;
LAB_0059a04a:
              do {
                while( true ) {
                  iVar7 = ReadNumber(&sd,&type_3);
                  uVar10 = (uint)type_3;
                  if (iVar7 != 0) goto LAB_00599da8;
                  uVar20 = CONCAT44(type_3._4_4_,(uint)type_3);
                  if (uVar20 == 0) {
                    if (UVar6 - UVar9 != local_168.NumTotalSubStreams) goto LAB_0059a3f4;
                    goto LAB_0059a3bd;
                  }
                  iVar7 = ReadNumber(&sd,&size);
                  pBVar15 = sd.Data;
                  if ((iVar7 != 0) || (iVar7 = iVar8, sd.Size < size)) goto LAB_00599da8;
                  if (uVar20 < 0x100) break;
switchD_0059a0cd_caseD_10:
                  sd.Data = sd.Data + size;
                  sd.Size = sd.Size - size;
                }
                switch(uVar10 & 0xff) {
                case 0xe:
                  goto switchD_0059a0cd_caseD_e;
                case 0xf:
                  if (sd.Size < local_1d0) goto LAB_00599da8;
                  local_1a0 = sd.Data;
                  sd.Data = sd.Data + local_1d0;
                  sd.Size = sd.Size - local_1d0;
                  goto LAB_0059a04a;
                default:
                  goto switchD_0059a0cd_caseD_10;
                case 0x11:
                  if (sd.Size == 0) goto LAB_00599da8;
                  sd.Size = sd.Size - 1;
                  pBVar15 = sd.Data + 1;
                  BVar2 = *sd.Data;
                  sd.Data = pBVar15;
                  if (BVar2 == '\0') {
                    pUVar14 = (UInt64 *)(size - 1);
                  }
                  else {
                    iVar7 = SzReadNumber32(&sd,(UInt32 *)&tempBuf);
                    if (iVar7 != 0) goto LAB_00599da8;
                    iVar7 = iVar8;
                    if ((UInt32)local_230 <= (uint)tempBuf.data) goto LAB_00599da8;
                    pBVar15 = (Byte *)(&pos)[((ulong)tempBuf.data & 0xffffffff) * 2];
                    pUVar14 = (&pUStack_b0)[((ulong)tempBuf.data & 0xffffffff) * 2];
                  }
                  iVar7 = iVar8;
                  if (((ulong)pUVar14 & 1) != 0) goto LAB_00599da8;
                  psVar11 = (size_t *)(*allocMain->Alloc)(allocMain,(size_t)local_198);
                  p->FileNameOffsets = psVar11;
                  if (psVar11 != (size_t *)0x0) {
                    pBVar12 = (Byte *)(*allocMain->Alloc)(allocMain,(size_t)pUVar14);
                    p->FileNames = pBVar12;
                    if (pBVar12 != (Byte *)0x0) {
                      memcpy(pBVar12,pBVar15,(size_t)pUVar14);
                      psVar11 = p->FileNameOffsets;
                      pBVar15 = p->FileNames;
                      *psVar11 = 0;
                      if ((((UVar6 == 0) || (pUVar14 < (UInt64 *)0x2)) ||
                          (pBVar15[(long)pUVar14 + -2] != '\0')) ||
                         (pBVar15[(long)pUVar14 + -1] != '\0')) goto LAB_00599da8;
                      pUVar23 = (UInt64 *)0x0;
                      uVar20 = uVar22;
                      do {
                        if (pUVar23 == pUVar14) goto LAB_00599da8;
                        psVar11 = psVar11 + 1;
                        do {
                          do {
                            pUVar24 = pUVar23;
                            pUVar23 = (UInt64 *)((long)pUVar24 + 2);
                          } while (pBVar15[(long)pUVar24] != '\0');
                        } while (pBVar15[(long)pUVar24 + 1] != '\0');
                        *psVar11 = (ulong)pUVar23 >> 1;
                        uVar10 = (int)uVar20 - 1;
                        uVar20 = (ulong)uVar10;
                      } while (uVar10 != 0);
                      if (pUVar14 != pUVar23) goto LAB_00599da8;
                      if (BVar2 == '\0') {
                        sd.Data = sd.Data + (long)pUVar14;
                        sd.Size = sd.Size - (long)pUVar14;
                      }
                      goto LAB_0059a04a;
                    }
                  }
                  iVar7 = 2;
                  goto LAB_00599da8;
                case 0x12:
                  p_01 = &p->CTime;
                  break;
                case 0x14:
                  p_01 = &p->MTime;
                  break;
                case 0x15:
                  SzBitUi32s_Free(p_00,allocMain);
                  iVar7 = ReadBitVector(&sd,UVar6,&p_00->Defs,allocMain);
                  if ((iVar7 != 0) || (iVar7 = iVar8, sd.Size == 0)) goto LAB_00599da8;
                  sd.Size = sd.Size - 1;
                  pBVar15 = sd.Data + 1;
                  BVar2 = *sd.Data;
                  sd2 = &sd;
                  sd.Data = pBVar15;
                  if (BVar2 != '\0') {
                    iVar7 = SzReadNumber32(&sd,&index_1);
                    if ((iVar7 != 0) || (iVar7 = iVar8, (UInt32)local_230 <= index_1))
                    goto LAB_00599da8;
                    tempBuf.data = (Byte *)(&pos)[(ulong)index_1 * 2];
                    tempBuf.size = (size_t)(&pUStack_b0)[(ulong)index_1 * 2];
                    sd2 = (CSzData *)&tempBuf;
                  }
                  iVar7 = ReadUi32s(sd2,UVar6,p_00,allocMain);
                  goto joined_r0x0059a228;
                }
                iVar7 = ReadTime(p_01,UVar6,&sd,(CBuf *)&pos,(UInt32)local_230,allocMain);
joined_r0x0059a228:
                if (iVar7 != 0) break;
              } while( true );
            }
          }
          else {
LAB_0059a3f4:
            iVar7 = 0x10;
          }
        }
      }
      goto LAB_00599da8;
    }
  }
  goto LAB_00599a81;
code_r0x00599ab0:
  pBVar12 = header + lVar28;
  pBVar15 = k7zSignature + lVar28;
  lVar28 = lVar28 + 1;
  if (*pBVar12 != *pBVar15) goto LAB_00599a81;
  goto LAB_00599aaa;
  while( true ) {
    if (tempBuf.data == (Byte *)0x0) {
      type_3._0_4_ = 0;
      pUVar13 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)((p->db).NumFolders + 1) << 2);
      p->FolderToFile = pUVar13;
      uVar19 = 0;
      iVar7 = 2;
      if (pUVar13 == (UInt32 *)0x0) break;
      if ((ulong)p->NumFiles == 0) {
        p->FileToFolder = (UInt32 *)0x0;
        sVar25 = 8;
      }
      else {
        pUVar13 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)p->NumFiles << 2);
        p->FileToFolder = pUVar13;
        if (pUVar13 == (UInt32 *)0x0) break;
        sVar25 = (ulong)(p->NumFiles + 1) << 3;
      }
      pUVar14 = (UInt64 *)(*allocMain->Alloc)(allocMain,sVar25);
      p->UnpackPositions = pUVar14;
      if (pUVar14 == (UInt64 *)0x0) break;
      uVar10 = p->NumFiles;
      if (uVar10 + 7 < 8) {
        p->IsDirs = (Byte *)0x0;
      }
      else {
        pBVar15 = (Byte *)(*allocMain->Alloc)(allocMain,0);
        p->IsDirs = pBVar15;
        if (pBVar15 == (Byte *)0x0) break;
        uVar10 = p->NumFiles;
      }
      if (uVar10 == 0) {
        (p->CRCs).Defs = (Byte *)0x0;
        (p->CRCs).Vals = (UInt32 *)0x0;
        local_1f8 = (UInt32 *)0x0;
      }
      else {
        pBVar15 = (Byte *)(*allocMain->Alloc)(allocMain,(ulong)uVar10 + 7 >> 3);
        (p->CRCs).Defs = pBVar15;
        if (pBVar15 == (Byte *)0x0) break;
        local_1f8 = (UInt32 *)(*allocMain->Alloc)(allocMain,(ulong)uVar10 << 2);
        (p->CRCs).Vals = local_1f8;
        if (local_1f8 == (UInt32 *)0x0) break;
      }
      local_1a8 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
      if (local_168.sdCRCs.Size == 0) {
        local_1d8 = (Byte *)0x0;
        local_1c8 = (Byte *)0x0;
      }
      else {
        local_168.sdCRCs.Size = local_168.sdCRCs.Size - 1;
        pBVar15 = local_168.sdCRCs.Data + 1;
        if (*local_168.sdCRCs.Data == '\0') {
          local_1c8 = pBVar15 + (local_168.NumSubDigests + 7 >> 3);
          local_1d8 = pBVar15;
          local_168.sdCRCs.Data = pBVar15;
        }
        else {
          local_1d8 = (Byte *)0x0;
          local_1a8 = 0;
          local_1c8 = pBVar15;
          local_168.sdCRCs.Data = pBVar15;
        }
      }
      local_218 = 0x80;
      iVar8 = 0x10;
      local_230 = 0;
      pBVar15 = (Byte *)0x0;
      local_1d0 = local_1d0 & 0xffffffff00000000;
      local_23c = 0;
      bVar26 = 0;
      bVar18 = 0;
      uVar20 = 0;
      local_1c0 = local_1c0 & 0xffffffff00000000;
      goto LAB_0059a5ee;
    }
    iVar7 = SkipData(&sd);
    if (iVar7 != 0) break;
LAB_0059a3bd:
    iVar7 = ReadNumber(&sd,(UInt64 *)&tempBuf);
    if (iVar7 != 0) break;
  }
  goto LAB_00599da8;
LAB_0059a5ee:
  uVar29 = uVar20 & 0xffffffff;
  if (local_230 == uVar22) goto code_r0x0059a9ab;
  if (local_218 == 0) {
    uVar10 = (UInt32)local_230 - 1 >> 3;
    p->IsDirs[uVar10] = bVar26;
    (p->CRCs).Defs[uVar10] = bVar18;
    local_1f8 = (p->CRCs).Vals;
    local_218 = 0x80;
    bVar26 = 0;
    bVar18 = 0;
  }
  local_198 = p->UnpackPositions;
  local_198[local_230] = (UInt64)pBVar15;
  local_1f8[local_230] = 0;
  bVar17 = (byte)local_230;
  if (local_1b8 == (Byte *)0x0) {
LAB_0059a6e6:
    if (local_23c == 0) {
      while( true ) {
        iVar7 = iVar8;
        if ((p->db).NumFolders <= uVar29) goto LAB_00599da8;
        p->FolderToFile[uVar29] = (UInt32)local_230;
        type_3._0_4_ = 1;
        uVar20 = uVar29;
        if (local_168.sdNumSubStreams.Data == (Byte *)0x0) break;
        iVar7 = SzReadNumber32(&local_168.sdNumSubStreams,(UInt32 *)&type_3);
        if (iVar7 != 0) goto LAB_00599da8;
        local_23c = (uint)type_3;
        if ((uint)type_3 != 0) goto LAB_0059a6ed;
        puVar1 = (p->db).CoderUnpackSizes +
                 ((uint)(p->db).FoToMainUnpackSizeIndex[uVar29] +
                 (p->db).FoToCoderUnpackSizes[uVar29]);
        bVar30 = CARRY8((ulong)pBVar15,*puVar1);
        pBVar15 = pBVar15 + *puVar1;
        iVar7 = iVar8;
        if (bVar30) goto LAB_00599da8;
        uVar29 = uVar29 + 1;
      }
      local_23c = 1;
    }
LAB_0059a6ed:
    p->FileToFolder[local_230] = (UInt32)uVar20;
    if (local_1b8 != (Byte *)0x0) {
      uVar16 = local_230 >> 3 & 0x1fffffff;
      uVar10 = 0x80 >> (bVar17 & 7);
LAB_0059a7e0:
      if ((uVar10 & local_1b8[uVar16]) != 0) goto LAB_0059a983;
    }
    uVar29 = local_1d0 & 0xffffffff;
    local_23c = local_23c - 1;
    if (local_23c == 0) {
      uVar21 = uVar20 & 0xffffffff;
      uVar16 = (p->db).CoderUnpackSizes
               [(uint)(p->db).FoToMainUnpackSizeIndex[uVar21] + (p->db).FoToCoderUnpackSizes[uVar21]
               ];
      uVar3 = local_198[p->FolderToFile[uVar21]];
      iVar7 = iVar8;
      if ((uVar16 < (long)pBVar15 - uVar3) ||
         (pBVar15 = (Byte *)(uVar3 + uVar16), CARRY8(uVar3,uVar16))) goto LAB_00599da8;
      if (((uint)type_3 == 1) &&
         ((pBVar12 = (p->db).FolderCRCs.Defs, pBVar12 != (Byte *)0x0 &&
          ((char)(pBVar12[local_230 >> 3 & 0x1fffffff] << (bVar17 & 7)) < '\0')))) {
        local_1f8[local_230] = (p->db).FolderCRCs.Vals[uVar21];
LAB_0059a96c:
        bVar18 = bVar18 | local_218;
      }
      else if (((char)local_1a8 == '\0') ||
              ((local_1d8 != (Byte *)0x0 && ((char)*local_1d8 < '\0')))) {
        local_1f8[local_230] = *(UInt32 *)(local_1c8 + uVar29 * 4);
        local_1d0 = CONCAT44(local_1d0._4_4_,(int)local_1d0 + 1);
        goto LAB_0059a96c;
      }
      uVar20 = (ulong)((int)uVar20 + 1);
      local_23c = 0;
    }
    else {
      iVar7 = ReadNumber(&local_168.sdSizes,(UInt64 *)&tempBuf);
      if ((iVar7 != 0) ||
         (bVar30 = CARRY8((ulong)pBVar15,(ulong)tempBuf.data),
         pBVar15 = pBVar15 + (long)tempBuf.data, iVar7 = iVar8, bVar30)) goto LAB_00599da8;
      if (((char)local_1a8 == '\0') || ((local_1d8 != (Byte *)0x0 && ((char)*local_1d8 < '\0')))) {
        local_1f8[local_230] = *(UInt32 *)(local_1c8 + uVar29 * 4);
        local_1d0 = CONCAT44(local_1d0._4_4_,(int)local_1d0 + 1);
        bVar18 = bVar18 | local_218;
      }
    }
  }
  else {
    uVar16 = local_230 >> 3 & 0x1fffffff;
    uVar10 = 0x80 >> (bVar17 & 7);
    if ((uVar10 & local_1b8[uVar16]) == 0) goto LAB_0059a6e6;
    bVar27 = local_218;
    if (local_1a0 != (Byte *)0x0) {
      if ((char)(local_1a0[(uint)local_1c0 >> 3] << ((byte)local_1c0 & 7)) < '\0') {
        bVar27 = 0;
      }
      local_1c0 = CONCAT44(local_1c0._4_4_,(uint)local_1c0 + 1);
    }
    bVar26 = bVar27 | bVar26;
    if (local_23c != 0) {
      p->FileToFolder[local_230] = (UInt32)uVar20;
      goto LAB_0059a7e0;
    }
    p->FileToFolder[local_230] = 0xffffffff;
    local_23c = 0;
  }
LAB_0059a983:
  local_218 = local_218 >> 1;
  local_230 = local_230 + 1;
  goto LAB_0059a5ee;
switchD_0059a0cd_caseD_e:
  if (sd.Size < local_1c0) goto LAB_00599da8;
  local_1b8 = sd.Data;
  sd.Data = sd.Data + local_1c0;
  sd.Size = sd.Size - local_1c0;
  UVar9 = CountDefinedBits(pBVar15,UVar6);
  goto LAB_0059a02b;
code_r0x0059a9ab:
  uVar10 = UVar6 - 1 >> 3;
  p->IsDirs[uVar10] = bVar26;
  (p->CRCs).Defs[uVar10] = bVar18;
  p->UnpackPositions[uVar22] = (UInt64)pBVar15;
  iVar7 = iVar8;
  if (local_23c == 0) {
    pUVar13 = p->FolderToFile;
    while (pUVar13[uVar29] = UVar6, uVar29 < (p->db).NumFolders) {
      iVar7 = iVar8;
      if (((local_168.sdNumSubStreams.Data == (Byte *)0x0) ||
          (iVar7 = SzReadNumber32(&local_168.sdNumSubStreams,(UInt32 *)&type_3), iVar7 != 0)) ||
         (uVar29 = uVar29 + 1, iVar7 = iVar8, (uint)type_3 != 0)) goto LAB_00599da8;
    }
    iVar7 = (uint)(local_168.sdNumSubStreams.Size != 0 &&
                  local_168.sdNumSubStreams.Data != (Byte *)0x0) << 4;
  }
LAB_00599da8:
  for (lVar28 = 0; lVar28 != 0x80; lVar28 = lVar28 + 0x10) {
    Buf_Free((CBuf *)((long)&pos + lVar28),local_1e8);
  }
  SVar5 = 0xb;
  if (sd.Size == 0) {
    SVar5 = 0;
  }
  if (iVar7 != 0) {
    SVar5 = iVar7;
  }
LAB_00599de9:
  Buf_Free(&buf,local_1e8);
  if (SVar5 == 0) {
LAB_00599e04:
    SVar5 = 0;
  }
  else {
LAB_00599a81:
    SzArEx_Free(p,allocMain);
  }
  return SVar5;
}

Assistant:

SRes SzArEx_Open(CSzArEx *p, ILookInStream *inStream,
    ISzAlloc *allocMain, ISzAlloc *allocTemp)
{
  SRes res = SzArEx_Open2(p, inStream, allocMain, allocTemp);
  if (res != SZ_OK)
    SzArEx_Free(p, allocMain);
  return res;
}